

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfread.c
# Opt level: O1

PCF_Property pcf_find_property(PCF_Face face,FT_String *prop)

{
  int iVar1;
  PCF_Property pPVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  PCF_Property pPVar6;
  ulong uVar7;
  
  pPVar2 = face->properties;
  iVar1 = face->nprops;
  if ((long)iVar1 < 1) {
    uVar7 = 0;
    bVar3 = true;
  }
  else {
    uVar7 = 0;
    bVar4 = false;
    pPVar6 = pPVar2;
    do {
      iVar5 = strcmp(pPVar6->name,prop);
      if (iVar5 == 0) {
        bVar4 = true;
      }
      uVar7 = uVar7 + 1;
      bVar3 = !bVar4;
    } while ((uVar7 < (ulong)(long)iVar1) && (pPVar6 = pPVar6 + 1, !bVar4));
  }
  pPVar6 = (PCF_Property)0x0;
  if (!bVar3) {
    pPVar6 = pPVar2 + (uVar7 - 1);
  }
  return pPVar6;
}

Assistant:

FT_LOCAL_DEF( PCF_Property )
  pcf_find_property( PCF_Face          face,
                     const FT_String*  prop )
  {
    PCF_Property  properties = face->properties;
    FT_Bool       found      = 0;
    int           i;


    for ( i = 0; i < face->nprops && !found; i++ )
    {
      if ( !ft_strcmp( properties[i].name, prop ) )
        found = 1;
    }

    if ( found )
      return properties + i - 1;
    else
      return NULL;
  }